

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

HighsStatus __thiscall HEkk::dualize(HEkk *this)

{
  vector<double,_std::allocator<double>_> *__x;
  vector<double,_std::allocator<double>_> *__x_00;
  vector<double,_std::allocator<double>_> *__x_01;
  vector<double,_std::allocator<double>_> *__x_02;
  int *piVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  pointer piVar7;
  pointer piVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  bool bVar12;
  HighsInt HVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  HighsSparseMatrix *this_00;
  HighsInt iEl;
  long lVar18;
  size_t iX;
  long lVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  vector<double,_std::allocator<double>_> *pvVar24;
  double one;
  double row_lower;
  pointer pdStack_280;
  pointer local_278;
  double row_upper;
  pointer piStack_260;
  pointer local_258;
  vector<double,_std::allocator<double>_> *local_250;
  HighsInt iCol;
  undefined4 uStack_244;
  HighsSparseMatrix *local_240;
  double local_238;
  vector<double,_std::allocator<double>_> *local_230;
  vector<double,_std::allocator<double>_> *local_228;
  vector<double,_std::allocator<double>_> *local_220;
  vector<double,_std::allocator<double>_> *local_218;
  undefined8 uStack_210;
  double local_208;
  undefined8 uStack_200;
  vector<double,_std::allocator<double>_> *local_1f8;
  vector<int,_std::allocator<int>_> *local_1f0;
  vector<double,_std::allocator<double>_> *local_1e8;
  double local_1e0;
  vector<int,_std::allocator<int>_> primal_bound_index;
  HighsSparseMatrix extra_columns;
  vector<double,_std::allocator<double>_> primal_bound_value;
  HighsInt dummy_row;
  double local_128;
  undefined8 uStack_120;
  HighsSparseMatrix local_110;
  HighsSparseMatrix dual_matrix;
  
  HVar13 = (this->lp_).num_row_;
  this->original_num_col_ = (this->lp_).num_col_;
  this->original_num_row_ = HVar13;
  local_240 = &(this->lp_).a_matrix_;
  HVar13 = HighsSparseMatrix::numNz(local_240);
  this->original_num_nz_ = HVar13;
  this->original_offset_ = (this->lp_).offset_;
  pvVar24 = &(this->lp_).col_cost_;
  local_218 = pvVar24;
  std::vector<double,_std::allocator<double>_>::operator=(&this->original_col_cost_,pvVar24);
  __x = &(this->lp_).col_lower_;
  local_250 = &this->original_col_lower_;
  std::vector<double,_std::allocator<double>_>::operator=(local_250,__x);
  __x_00 = &(this->lp_).col_upper_;
  local_1e8 = &this->original_col_upper_;
  std::vector<double,_std::allocator<double>_>::operator=(local_1e8,__x_00);
  __x_01 = &(this->lp_).row_lower_;
  local_230 = &this->original_row_lower_;
  std::vector<double,_std::allocator<double>_>::operator=(local_230,__x_01);
  __x_02 = &(this->lp_).row_upper_;
  local_1f8 = &this->original_row_upper_;
  std::vector<double,_std::allocator<double>_>::operator=(local_1f8,__x_02);
  std::vector<double,_std::allocator<double>_>::reserve(pvVar24,(long)this->original_num_row_);
  std::vector<double,_std::allocator<double>_>::reserve(__x,(long)this->original_num_row_);
  std::vector<double,_std::allocator<double>_>::reserve(__x_00,(long)this->original_num_row_);
  std::vector<double,_std::allocator<double>_>::reserve(__x_01,(long)this->original_num_col_);
  std::vector<double,_std::allocator<double>_>::reserve(__x_02,(long)this->original_num_col_);
  iVar20 = 0;
  std::vector<double,_std::allocator<double>_>::resize(local_218,0);
  local_220 = __x;
  std::vector<double,_std::allocator<double>_>::resize(__x,0);
  local_228 = __x_00;
  std::vector<double,_std::allocator<double>_>::resize(__x_00,0);
  std::vector<double,_std::allocator<double>_>::resize(__x_01,0);
  std::vector<double,_std::allocator<double>_>::resize(__x_02,0);
  HighsSparseMatrix::HighsSparseMatrix(&dual_matrix,local_240);
  iVar14 = this->original_num_col_;
  dual_matrix.num_col_ = this->original_num_row_;
  dual_matrix.format_ = kRowwise;
  primal_bound_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  primal_bound_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  primal_bound_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  primal_bound_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  primal_bound_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  primal_bound_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1f0 = &this->upper_bound_col_;
  dual_matrix.num_row_ = iVar14;
  while( true ) {
    pvVar24 = local_1f8;
    one = (double)CONCAT44(one._4_4_,iVar20);
    if (iVar14 <= iVar20) break;
    dVar2 = (local_250->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar20];
    dVar3 = (local_1e8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar20];
    extra_columns.format_ = 0;
    extra_columns.num_col_ = 0x7ff00000;
    row_lower = INFINITY;
    row_upper = -INFINITY;
    if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) {
      uStack_120 = 0;
      local_238 = (this->original_col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[iVar20];
      local_208 = dVar3;
      local_128 = dVar2;
      bVar12 = highs_isInfinity(-dVar2);
      if (bVar12) {
        bVar12 = highs_isInfinity(local_208);
        if (!bVar12) {
          extra_columns._0_8_ = local_208;
          row_lower = local_238;
          goto LAB_0032a4b3;
        }
        extra_columns.format_ = 0;
        extra_columns.num_col_ = 0;
        row_lower = local_238;
        row_upper = row_lower;
      }
      else {
        bVar12 = highs_isInfinity(local_208);
        extra_columns._0_8_ = local_128;
        row_lower = -INFINITY;
        row_upper = local_238;
        if (!bVar12) {
          std::vector<int,_std::allocator<int>_>::push_back(local_1f0,(value_type_conflict2 *)&one);
        }
      }
    }
    else {
      row_lower = -INFINITY;
      extra_columns._0_8_ = dVar2;
LAB_0032a4b3:
      row_upper = INFINITY;
    }
    std::vector<double,_std::allocator<double>_>::push_back(__x_01,&row_lower);
    std::vector<double,_std::allocator<double>_>::push_back(__x_02,&row_upper);
    if (((double)extra_columns._0_8_ != 0.0) || (NAN((double)extra_columns._0_8_))) {
      std::vector<double,_std::allocator<double>_>::push_back
                (&primal_bound_value,(value_type_conflict1 *)&extra_columns);
      std::vector<int,_std::allocator<int>_>::push_back
                (&primal_bound_index,(value_type_conflict2 *)&one);
    }
    iVar20 = one._0_4_ + 1;
    iVar14 = this->original_num_col_;
  }
  local_250 = (vector<double,_std::allocator<double>_> *)&this->upper_bound_row_;
  iVar14 = 0;
  while( true ) {
    one = (double)CONCAT44(one._4_4_,iVar14);
    if (this->original_num_row_ <= iVar14) break;
    dVar2 = (local_230->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar14];
    dVar3 = (pvVar24->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar14];
    extra_columns.format_ = 0;
    extra_columns.num_col_ = 0x7ff00000;
    row_lower = INFINITY;
    row_upper = -INFINITY;
    if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) {
      uStack_200 = 0;
      local_208 = dVar2;
      bVar12 = highs_isInfinity(-dVar2);
      if (bVar12) {
        bVar12 = highs_isInfinity(dVar3);
        if (bVar12) {
          extra_columns.format_ = 0;
          extra_columns.num_col_ = 0;
          row_lower = 0.0;
        }
        else {
          row_lower = -INFINITY;
          extra_columns._0_8_ = dVar3;
        }
        row_upper = 0.0;
      }
      else {
        bVar12 = highs_isInfinity(dVar3);
        row_lower = 0.0;
        extra_columns._0_8_ = local_208;
        row_upper = INFINITY;
        if (!bVar12) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_250,(value_type_conflict2 *)&one);
        }
      }
    }
    else {
      row_lower = -INFINITY;
      row_upper = INFINITY;
      extra_columns._0_8_ = dVar2;
    }
    std::vector<double,_std::allocator<double>_>::push_back
              (local_218,(value_type_conflict1 *)&extra_columns);
    std::vector<double,_std::allocator<double>_>::push_back(local_220,&row_lower);
    std::vector<double,_std::allocator<double>_>::push_back(local_228,&row_upper);
    iVar14 = one._0_4_ + 1;
  }
  HighsSparseMatrix::HighsSparseMatrix(&extra_columns);
  HighsSparseMatrix::ensureColwise(&extra_columns);
  extra_columns.num_row_ = this->original_num_col_;
  local_230 = (vector<double,_std::allocator<double>_> *)
              ((long)(this->upper_bound_row_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->upper_bound_row_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  uVar16 = (ulong)((long)(this->upper_bound_col_).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->upper_bound_col_).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 2;
  uVar23 = (ulong)local_230 >> 2;
  one = 1.0;
  uVar17 = 0;
  iVar14 = (int)uVar16;
  uVar22 = 0;
  if (0 < iVar14) {
    uVar22 = uVar16 & 0xffffffff;
  }
  for (; uVar22 != uVar17; uVar17 = uVar17 + 1) {
    iVar20 = (local_1f0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar17];
    _iCol = (double)CONCAT44(uStack_244,iVar20);
    row_lower = (local_1e8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[iVar20];
    HighsSparseMatrix::addVec(&extra_columns,1,&iCol,&one,1.0);
    std::vector<double,_std::allocator<double>_>::push_back(local_218,&row_lower);
    row_upper = -INFINITY;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_220,&row_upper);
    row_upper = 0.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_228,&row_upper);
  }
  iVar20 = (int)uVar23;
  this_00 = local_240;
  if (iVar20 != 0) {
    row_lower = 0.0;
    pdStack_280 = (pointer)0x0;
    local_278 = (pointer)0x0;
    row_upper = 0.0;
    piStack_260 = (pointer)0x0;
    local_258 = (pointer)0x0;
    dummy_row = iVar20;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              ((vector<int,_std::allocator<int>_> *)&row_lower,(long)this->original_num_row_,
               &dummy_row);
    _iCol = (double)((ulong)_iCol & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              ((vector<int,_std::allocator<int>_> *)&row_upper,
               (long)local_230 * 0x40000000 + 0x100000000 >> 0x20,&iCol);
    uVar16 = 0;
    uVar17 = 0;
    if (0 < iVar20) {
      uVar17 = uVar23 & 0xffffffff;
    }
    for (; this_00 = local_240, uVar17 != uVar16; uVar16 = uVar16 + 1) {
      lVar15 = (long)(((_Vector_base<int,_std::allocator<int>_> *)
                      &local_250->super__Vector_base<double,_std::allocator<double>_>)->_M_impl).
                     super__Vector_impl_data._M_start[uVar16];
      *(int *)((long)row_lower + lVar15 * 4) = (int)uVar16;
      _iCol = (local_1f8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar15];
      std::vector<double,_std::allocator<double>_>::push_back
                (local_218,(value_type_conflict1 *)&iCol);
      local_1e0 = -INFINITY;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_220,&local_1e0);
      local_1e0 = 0.0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_228,&local_1e0);
    }
    piVar7 = (this->lp_).a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar15 = 0; lVar15 < this->original_num_nz_; lVar15 = lVar15 + 1) {
      piVar1 = (int *)((long)row_upper +
                      (long)*(int *)((long)row_lower + (long)piVar7[lVar15] * 4) * 4);
      *piVar1 = *piVar1 + 1;
    }
    std::vector<int,_std::allocator<int>_>::resize
              (&extra_columns.start_,(long)(iVar20 + iVar14 + 1));
    for (uVar16 = 0; uVar17 != uVar16; uVar16 = uVar16 + 1) {
      extra_columns.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[(long)iVar14 + uVar16 + 1] =
           *(int *)((long)row_upper + uVar16 * 4) +
           extra_columns.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[(long)iVar14 + uVar16];
      *(int *)((long)row_upper + uVar16 * 4) =
           extra_columns.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[(long)iVar14 + uVar16];
    }
    iVar4 = extra_columns.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar20 + iVar14];
    std::vector<int,_std::allocator<int>_>::resize(&extra_columns.index_,(long)iVar4);
    std::vector<double,_std::allocator<double>_>::resize(&extra_columns.value_,(long)iVar4);
    piVar7 = (this->lp_).a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar15 = 0;
    while (lVar19 = lVar15, lVar19 < this->original_num_col_) {
      piVar8 = (this->lp_).a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (this->lp_).a_matrix_.value_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      for (lVar18 = (long)piVar7[lVar19]; lVar15 = lVar19 + 1, lVar18 < piVar7[lVar19 + 1];
          lVar18 = lVar18 + 1) {
        iVar4 = *(int *)((long)row_lower + (long)piVar8[lVar18] * 4);
        if (iVar4 < iVar20) {
          iVar5 = *(int *)((long)row_upper + (long)iVar4 * 4);
          extra_columns.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar5] = (int)lVar19;
          extra_columns.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar5] = pdVar9[lVar18];
          piVar1 = (int *)((long)row_upper + (long)iVar4 * 4);
          *piVar1 = *piVar1 + 1;
        }
      }
    }
    extra_columns.num_col_ = extra_columns.num_col_ + iVar20;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&row_upper);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&row_lower);
  }
  pdVar9 = (this->original_col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (this->lp_).a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar24 = (vector<double,_std::allocator<double>_> *)0x0;
  for (lVar15 = 0;
      lVar15 != (long)primal_bound_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)primal_bound_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2; lVar15 = lVar15 + 1) {
    lVar19 = (long)primal_bound_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar15];
    dVar2 = primal_bound_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar15];
    dVar3 = pdVar9[lVar19];
    iVar4 = piVar7[lVar19 + 1];
    pdVar10 = (this->lp_).a_matrix_.value_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar11 = (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar8 = (this->lp_).a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar19 = (long)piVar7[lVar19]; lVar19 < iVar4; lVar19 = lVar19 + 1) {
      iVar5 = piVar8[lVar19];
      pdVar11[iVar5] = pdVar10[lVar19] * -dVar2 + pdVar11[iVar5];
    }
    pvVar24 = (vector<double,_std::allocator<double>_> *)((double)pvVar24 + dVar2 * dVar3);
  }
  if (extra_columns.num_col_ != 0) {
    uStack_210 = 0;
    row_lower = 0.0;
    pdStack_280 = (pointer)0x0;
    local_278 = (pointer)0x0;
    row_upper = 0.0;
    local_218 = pvVar24;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)&row_lower,(long)this->original_num_col_,
               &row_upper);
    for (lVar15 = 0;
        (long)primal_bound_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)primal_bound_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2 != lVar15; lVar15 = lVar15 + 1) {
      *(double *)
       ((long)row_lower +
       (long)primal_bound_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar15] * 8) =
           primal_bound_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar15];
    }
    iVar4 = this->original_num_row_;
    uVar16 = (ulong)(uint)extra_columns.num_col_;
    if (extra_columns.num_col_ < 1) {
      uVar16 = 0;
    }
    pdVar9 = (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar17 = 0;
    while (uVar17 != uVar16) {
      dVar2 = pdVar9[(long)iVar4 + uVar17];
      for (lVar15 = (long)extra_columns.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start[uVar17];
          lVar15 < extra_columns.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar17 + 1]; lVar15 = lVar15 + 1) {
        dVar2 = dVar2 - *(double *)
                         ((long)row_lower +
                         (long)extra_columns.index_.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar15] * 8) *
                        extra_columns.value_.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar15];
      }
      pdVar9[(long)iVar4 + uVar17] = dVar2;
      uVar17 = uVar17 + 1;
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&row_lower);
    pvVar24 = local_218;
  }
  (this->lp_).offset_ = (double)pvVar24 + (this->lp_).offset_;
  HighsSparseMatrix::operator=(this_00,&dual_matrix);
  HighsSparseMatrix::ensureColwise(this_00);
  HighsSparseMatrix::HighsSparseMatrix(&local_110,&extra_columns);
  HighsSparseMatrix::addCols(this_00,&local_110,(int8_t *)0x0);
  HighsSparseMatrix::~HighsSparseMatrix(&local_110);
  uVar21 = iVar20 + iVar14 + this->original_num_row_;
  uVar6 = this->original_num_col_;
  bVar12 = (this->lp_).sense_ != kMinimize;
  (this->lp_).sense_ = (bVar12 - 1) + (uint)bVar12;
  (this->lp_).num_col_ = uVar21;
  (this->lp_).num_row_ = uVar6;
  (this->status_).is_dualized = true;
  (this->status_).has_basis = false;
  (this->status_).has_ar_matrix = false;
  (this->status_).has_nla = false;
  highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
               "Solving dual LP with %d columns",(ulong)uVar21);
  if (iVar20 + iVar14 == 0) goto LAB_0032adcf;
  highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo," [%d extra from",
               (ulong)(uVar21 - this->original_num_row_));
  if (iVar14 == 0) {
    if (iVar20 != 0) goto LAB_0032ad98;
  }
  else {
    highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                 " %d boxed variable(s)");
    if (iVar20 != 0) {
      highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo," and");
LAB_0032ad98:
      highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                   " %d boxed constraint(s)",uVar23 & 0xffffffff);
    }
  }
  highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,"]");
LAB_0032adcf:
  highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo," and %d rows\n",
               (ulong)uVar6);
  HighsSparseMatrix::~HighsSparseMatrix(&extra_columns);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&primal_bound_index.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&primal_bound_value.super__Vector_base<double,_std::allocator<double>_>);
  HighsSparseMatrix::~HighsSparseMatrix(&dual_matrix);
  return kOk;
}

Assistant:

HighsStatus HEkk::dualize() {
  assert(lp_.a_matrix_.isColwise());
  original_num_col_ = lp_.num_col_;
  original_num_row_ = lp_.num_row_;
  original_num_nz_ = lp_.a_matrix_.numNz();
  original_offset_ = lp_.offset_;
  original_col_cost_ = lp_.col_cost_;
  original_col_lower_ = lp_.col_lower_;
  original_col_upper_ = lp_.col_upper_;
  original_row_lower_ = lp_.row_lower_;
  original_row_upper_ = lp_.row_upper_;
  // Reserve space for simple dual
  lp_.col_cost_.reserve(original_num_row_);
  lp_.col_lower_.reserve(original_num_row_);
  lp_.col_upper_.reserve(original_num_row_);
  lp_.row_lower_.reserve(original_num_col_);
  lp_.row_upper_.reserve(original_num_col_);
  // Invalidate the original data
  lp_.col_cost_.resize(0);
  lp_.col_lower_.resize(0);
  lp_.col_upper_.resize(0);
  lp_.row_lower_.resize(0);
  lp_.row_upper_.resize(0);
  // The bulk of the constraint matrix of the dual LP is the transpose
  // of the primal constraint matrix. This is obtained row-wise by
  // copying the matrix and flipping the dimensions
  HighsSparseMatrix dual_matrix = lp_.a_matrix_;
  dual_matrix.num_row_ = original_num_col_;
  dual_matrix.num_col_ = original_num_row_;
  dual_matrix.format_ = MatrixFormat::kRowwise;
  // The primal_bound_value vector accumulates the values of the
  // finite bounds on variables - or zero for a free variable - used
  // later to compute the offset and shift for the costs. Many of
  // these components will be zero - all for the case x>=0 - so
  // maintain a list of the nonzeros and corresponding indices. Don't
  // reserve space since they may not be needed
  vector<double> primal_bound_value;
  vector<HighsInt> primal_bound_index;
  const double inf = kHighsInf;
  for (HighsInt iCol = 0; iCol < original_num_col_; iCol++) {
    const double cost = original_col_cost_[iCol];
    const double lower = original_col_lower_[iCol];
    const double upper = original_col_upper_[iCol];
    double primal_bound = inf;
    double row_lower = inf;
    double row_upper = -inf;
    if (lower == upper) {
      // Fixed
      primal_bound = lower;
      // Dual activity a^Ty is free, implying dual for primal column
      // (slack for dual row) is free
      row_lower = -inf;
      row_upper = inf;
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed
        //
        // Treat as lower
        primal_bound = lower;
        // Dual activity a^Ty is bounded above by cost, implying dual
        // for primal column (slack for dual row) is non-negative
        row_lower = -inf;
        row_upper = cost;
        // Treat upper bound as additional constraint
        upper_bound_col_.push_back(iCol);
      } else {
        // Lower (since upper bound is infinite)
        primal_bound = lower;
        // Dual activity a^Ty is bounded above by cost, implying dual
        // for primal column (slack for dual row) is non-negative
        row_lower = -inf;
        row_upper = cost;
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      primal_bound = upper;
      // Dual activity a^Ty is bounded below by cost, implying dual
      // for primal column (slack for dual row) is non-positive
      row_lower = cost;
      row_upper = inf;
    } else {
      // FREE
      //
      // Dual activity a^Ty is fixed by cost, implying dual for primal
      // column (slack for dual row) is fixed at zero
      primal_bound = 0;
      row_lower = cost;
      row_upper = cost;
    }
    assert(row_lower < inf);
    assert(row_upper > -inf);
    assert(primal_bound < inf);
    lp_.row_lower_.push_back(row_lower);
    lp_.row_upper_.push_back(row_upper);
    if (primal_bound) {
      primal_bound_value.push_back(primal_bound);
      primal_bound_index.push_back(iCol);
    }
  }
  for (HighsInt iRow = 0; iRow < original_num_row_; iRow++) {
    double lower = original_row_lower_[iRow];
    double upper = original_row_upper_[iRow];
    double col_cost = inf;
    double col_lower = inf;
    double col_upper = -inf;
    if (lower == upper) {
      // Equality constraint
      //
      // Dual variable has primal RHS as cost and is free
      col_cost = lower;
      col_lower = -inf;
      col_upper = inf;
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed
        //
        // Treat as lower
        col_cost = lower;
        col_lower = 0;
        col_upper = inf;
        // Treat upper bound as additional constraint
        upper_bound_row_.push_back(iRow);
      } else {
        // Lower (since upper bound is infinite)
        col_cost = lower;
        col_lower = 0;
        col_upper = inf;
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      col_cost = upper;
      col_lower = -inf;
      col_upper = 0;
    } else {
      // FREE
      // Shouldn't get free rows, but handle them anyway
      col_cost = 0;
      col_lower = 0;
      col_upper = 0;
    }
    assert(col_lower < inf);
    assert(col_upper > -inf);
    assert(col_cost < inf);
    lp_.col_cost_.push_back(col_cost);
    lp_.col_lower_.push_back(col_lower);
    lp_.col_upper_.push_back(col_upper);
  }
  vector<HighsInt>& start = lp_.a_matrix_.start_;
  vector<HighsInt>& index = lp_.a_matrix_.index_;
  vector<double>& value = lp_.a_matrix_.value_;
  // Boxed variables and constraints yield extra columns in the dual LP
  HighsSparseMatrix extra_columns;
  extra_columns.ensureColwise();
  extra_columns.num_row_ = original_num_col_;
  HighsInt num_upper_bound_col = upper_bound_col_.size();
  HighsInt num_upper_bound_row = upper_bound_row_.size();
  double one = 1;
  for (HighsInt iX = 0; iX < num_upper_bound_col; iX++) {
    HighsInt iCol = upper_bound_col_[iX];
    const double upper = original_col_upper_[iCol];
    extra_columns.addVec(1, &iCol, &one);
    lp_.col_cost_.push_back(upper);
    lp_.col_lower_.push_back(-inf);
    lp_.col_upper_.push_back(0);
  }

  if (num_upper_bound_row) {
    // Need to identify the submatrix of constraint matrix rows
    // corresponding to those with a row index in
    // upper_bound_row_. When identifying numbers of entries in each
    // row of submatrix, use indirection to get corresponding row
    // index, with a dummy row for rows not in the submatrix.
    HighsInt dummy_row = num_upper_bound_row;
    vector<HighsInt> indirection;
    vector<HighsInt> count;
    indirection.assign(original_num_row_, dummy_row);
    count.assign(num_upper_bound_row + 1, 0);
    HighsInt extra_iRow = 0;
    for (HighsInt iX = 0; iX < num_upper_bound_row; iX++) {
      HighsInt iRow = upper_bound_row_[iX];
      indirection[iRow] = extra_iRow++;
      double upper = original_row_upper_[iRow];
      lp_.col_cost_.push_back(upper);
      lp_.col_lower_.push_back(-inf);
      lp_.col_upper_.push_back(0);
    }
    for (HighsInt iEl = 0; iEl < original_num_nz_; iEl++)
      count[indirection[index[iEl]]]++;
    extra_columns.start_.resize(num_upper_bound_col + num_upper_bound_row + 1);
    for (HighsInt iRow = 0; iRow < num_upper_bound_row; iRow++) {
      extra_columns.start_[num_upper_bound_col + iRow + 1] =
          extra_columns.start_[num_upper_bound_col + iRow] + count[iRow];
      count[iRow] = extra_columns.start_[num_upper_bound_col + iRow];
    }
    HighsInt extra_columns_num_nz =
        extra_columns.start_[num_upper_bound_col + num_upper_bound_row];
    extra_columns.index_.resize(extra_columns_num_nz);
    extra_columns.value_.resize(extra_columns_num_nz);
    for (HighsInt iCol = 0; iCol < original_num_col_; iCol++) {
      for (HighsInt iEl = start[iCol]; iEl < start[iCol + 1]; iEl++) {
        HighsInt iRow = indirection[index[iEl]];
        if (iRow < num_upper_bound_row) {
          HighsInt extra_columns_iEl = count[iRow];
          assert(extra_columns_iEl < extra_columns_num_nz);
          extra_columns.index_[extra_columns_iEl] = iCol;
          extra_columns.value_[extra_columns_iEl] = value[iEl];
          count[iRow]++;
        }
      }
    }
    extra_columns.num_col_ += num_upper_bound_row;
  }
  // Incorporate the cost shift by subtracting A*primal_bound from the
  // cost vector; compute the objective offset
  double delta_offset = 0;
  for (size_t iX = 0; iX < primal_bound_index.size(); iX++) {
    HighsInt iCol = primal_bound_index[iX];
    double multiplier = primal_bound_value[iX];
    delta_offset += multiplier * original_col_cost_[iCol];
    for (HighsInt iEl = start[iCol]; iEl < start[iCol + 1]; iEl++)
      lp_.col_cost_[index[iEl]] -= multiplier * value[iEl];
  }
  if (extra_columns.num_col_) {
    // Incorporate the cost shift by subtracting
    // extra_columns*primal_bound from the cost vector for the extra
    // dual variables
    //
    // Have to scatter the packed primal bound values into a
    // full-length vector
    //
    // ToDo Make this more efficient?
    vector<double> primal_bound;
    primal_bound.assign(original_num_col_, 0);
    for (size_t iX = 0; iX < primal_bound_index.size(); iX++)
      primal_bound[primal_bound_index[iX]] = primal_bound_value[iX];

    for (HighsInt iCol = 0; iCol < extra_columns.num_col_; iCol++) {
      double cost = lp_.col_cost_[original_num_row_ + iCol];
      for (HighsInt iEl = extra_columns.start_[iCol];
           iEl < extra_columns.start_[iCol + 1]; iEl++)
        cost -=
            primal_bound[extra_columns.index_[iEl]] * extra_columns.value_[iEl];
      lp_.col_cost_[original_num_row_ + iCol] = cost;
    }
  }
  lp_.offset_ += delta_offset;
  // Copy the row-wise dual LP constraint matrix and transpose it.
  // ToDo Make this more efficient
  lp_.a_matrix_ = dual_matrix;
  lp_.a_matrix_.ensureColwise();
  // Add the extra columns to the dual LP constraint matrix
  lp_.a_matrix_.addCols(extra_columns);

  HighsInt dual_num_col =
      original_num_row_ + num_upper_bound_col + num_upper_bound_row;
  HighsInt dual_num_row = original_num_col_;
  assert(dual_num_col == (int)lp_.col_cost_.size());
  assert(lp_.a_matrix_.num_col_ == dual_num_col);
  const bool ignore_scaling = true;
  if (!ignore_scaling) {
    // Flip any scale factors
    if (lp_.scale_.has_scaling) {
      std::vector<double> temp_scale = lp_.scale_.row;
      lp_.scale_.row = lp_.scale_.col;
      lp_.scale_.col = temp_scale;
      lp_.scale_.num_col = dual_num_col;
      lp_.scale_.num_row = dual_num_row;
    }
  }
  // Change optimization sense
  if (lp_.sense_ == ObjSense::kMinimize) {
    lp_.sense_ = ObjSense::kMaximize;
  } else {
    lp_.sense_ = ObjSense::kMinimize;
  }
  // Flip LP dimensions
  lp_.num_col_ = dual_num_col;
  lp_.num_row_ = dual_num_row;
  status_.is_dualized = true;
  status_.has_basis = false;
  status_.has_ar_matrix = false;
  status_.has_nla = false;
  highsLogUser(options_->log_options, HighsLogType::kInfo,
               "Solving dual LP with %d columns", (int)dual_num_col);
  if (num_upper_bound_col + num_upper_bound_row) {
    highsLogUser(options_->log_options, HighsLogType::kInfo, " [%d extra from",
                 (int)dual_num_col - original_num_row_);
    if (num_upper_bound_col)
      highsLogUser(options_->log_options, HighsLogType::kInfo,
                   " %d boxed variable(s)", (int)num_upper_bound_col);
    if (num_upper_bound_col && num_upper_bound_row)
      highsLogUser(options_->log_options, HighsLogType::kInfo, " and");
    if (num_upper_bound_row)
      highsLogUser(options_->log_options, HighsLogType::kInfo,
                   " %d boxed constraint(s)", (int)num_upper_bound_row);
    highsLogUser(options_->log_options, HighsLogType::kInfo, "]");
  }
  highsLogUser(options_->log_options, HighsLogType::kInfo, " and %d rows\n",
               (int)dual_num_row);
  //  reportLp(options_->log_options, lp_, HighsLogType::kVerbose);
  return HighsStatus::kOk;
}